

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

void __thiscall
gl4cts::ShaderSubroutine::Utils::program::build
          (program *this,GLchar *compute_shader_code,GLchar *fragment_shader_code,
          GLchar *geometry_shader_code,GLchar *tesselation_control_shader_code,
          GLchar *tesselation_evaluation_shader_code,GLchar *vertex_shader_code,
          GLchar **varying_names,GLuint n_varying_names,bool is_separable)

{
  int iVar1;
  GLuint GVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *__to;
  char *__from;
  Functions *gl;
  bool is_separable_local;
  GLchar *tesselation_evaluation_shader_code_local;
  GLchar *tesselation_control_shader_code_local;
  GLchar *geometry_shader_code_local;
  GLchar *fragment_shader_code_local;
  GLchar *compute_shader_code_local;
  program *this_local;
  long lVar5;
  
  pRVar4 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar1);
  if (compute_shader_code != (GLchar *)0x0) {
    GVar2 = (**(code **)(lVar5 + 0x3f0))(0x91b9);
    this->m_compute_shader_id = GVar2;
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"CreateShader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x102);
    compile(this,this->m_compute_shader_id,compute_shader_code);
  }
  if (fragment_shader_code != (GLchar *)0x0) {
    GVar2 = (**(code **)(lVar5 + 0x3f0))(0x8b30);
    this->m_fragment_shader_id = GVar2;
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"CreateShader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x10a);
    compile(this,this->m_fragment_shader_id,fragment_shader_code);
  }
  if (geometry_shader_code != (GLchar *)0x0) {
    GVar2 = (**(code **)(lVar5 + 0x3f0))(0x8dd9);
    this->m_geometry_shader_id = GVar2;
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"CreateShader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x112);
    compile(this,this->m_geometry_shader_id,geometry_shader_code);
  }
  if (tesselation_control_shader_code != (GLchar *)0x0) {
    GVar2 = (**(code **)(lVar5 + 0x3f0))(0x8e88);
    this->m_tesselation_control_shader_id = GVar2;
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"CreateShader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x11a);
    compile(this,this->m_tesselation_control_shader_id,tesselation_control_shader_code);
  }
  if (tesselation_evaluation_shader_code != (GLchar *)0x0) {
    GVar2 = (**(code **)(lVar5 + 0x3f0))(0x8e87);
    this->m_tesselation_evaluation_shader_id = GVar2;
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"CreateShader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x122);
    compile(this,this->m_tesselation_evaluation_shader_id,tesselation_evaluation_shader_code);
  }
  if (vertex_shader_code != (GLchar *)0x0) {
    GVar2 = (**(code **)(lVar5 + 0x3f0))(0x8b31);
    this->m_vertex_shader_id = GVar2;
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"CreateShader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x12a);
    compile(this,this->m_vertex_shader_id,vertex_shader_code);
  }
  GVar2 = (**(code **)(lVar5 + 0x3c8))();
  this->m_program_object_id = GVar2;
  dVar3 = (**(code **)(lVar5 + 0x800))();
  __from = "CreateProgram";
  glu::checkError(dVar3,"CreateProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x131);
  __to = extraout_RDX;
  if (n_varying_names != 0) {
    (**(code **)(lVar5 + 0x14c8))(this->m_program_object_id,n_varying_names,varying_names,0x8c8c);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    __from = "TransformFeedbackVaryings";
    glu::checkError(dVar3,"TransformFeedbackVaryings",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x137);
    __to = extraout_RDX_00;
  }
  if (is_separable) {
    (**(code **)(lVar5 + 0x1058))(this->m_program_object_id,0x8258,1);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    __from = "ProgramParameteri";
    glu::checkError(dVar3,"ProgramParameteri",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x13e);
    __to = extraout_RDX_01;
  }
  link(this,__from,__to);
  return;
}

Assistant:

void Utils::program::build(const glw::GLchar* compute_shader_code, const glw::GLchar* fragment_shader_code,
						   const glw::GLchar* geometry_shader_code, const glw::GLchar* tesselation_control_shader_code,
						   const glw::GLchar* tesselation_evaluation_shader_code, const glw::GLchar* vertex_shader_code,
						   const glw::GLchar* const* varying_names, glw::GLuint n_varying_names, bool is_separable)
{
	/* GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create shader objects and compile */
	if (0 != compute_shader_code)
	{
		m_compute_shader_id = gl.createShader(ARB_COMPUTE_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "CreateShader");

		compile(m_compute_shader_id, compute_shader_code);
	}

	if (0 != fragment_shader_code)
	{
		m_fragment_shader_id = gl.createShader(GL_FRAGMENT_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "CreateShader");

		compile(m_fragment_shader_id, fragment_shader_code);
	}

	if (0 != geometry_shader_code)
	{
		m_geometry_shader_id = gl.createShader(GL_GEOMETRY_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "CreateShader");

		compile(m_geometry_shader_id, geometry_shader_code);
	}

	if (0 != tesselation_control_shader_code)
	{
		m_tesselation_control_shader_id = gl.createShader(GL_TESS_CONTROL_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "CreateShader");

		compile(m_tesselation_control_shader_id, tesselation_control_shader_code);
	}

	if (0 != tesselation_evaluation_shader_code)
	{
		m_tesselation_evaluation_shader_id = gl.createShader(GL_TESS_EVALUATION_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "CreateShader");

		compile(m_tesselation_evaluation_shader_id, tesselation_evaluation_shader_code);
	}

	if (0 != vertex_shader_code)
	{
		m_vertex_shader_id = gl.createShader(GL_VERTEX_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "CreateShader");

		compile(m_vertex_shader_id, vertex_shader_code);
	}

	/* Create program object */
	m_program_object_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "CreateProgram");

	/* Set up captyured varyings' names */
	if (0 != n_varying_names)
	{
		gl.transformFeedbackVaryings(m_program_object_id, n_varying_names, varying_names, GL_INTERLEAVED_ATTRIBS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TransformFeedbackVaryings");
	}

	/* Set separable parameter */
	if (true == is_separable)
	{
		gl.programParameteri(m_program_object_id, GL_PROGRAM_SEPARABLE, GL_TRUE);
		GLU_EXPECT_NO_ERROR(gl.getError(), "ProgramParameteri");
	}

	/* Link program */
	link();
}